

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predict.c
# Opt level: O3

void exit_with_help(void)

{
  puts(
      "Usage: predict [options] test_file model_file output_file\noptions:\n-b probability_estimates: whether to output probability estimates, 0 or 1 (default 0); currently for logistic regression only\n-q : quiet mode (no outputs)"
      );
  exit(1);
}

Assistant:

void exit_with_help()
{
	printf(
	"Usage: predict [options] test_file model_file output_file\n"
	"options:\n"
	"-b probability_estimates: whether to output probability estimates, 0 or 1 (default 0); currently for logistic regression only\n"
	"-q : quiet mode (no outputs)\n"
	);
	exit(1);
}